

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

z_uLong z_crc32(uint crc,uchar *buf,uint len)

{
  u4 endian;
  uint len_local;
  uchar *buf_local;
  uint crc_local;
  
  if (buf == (uchar *)0x0) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = crc32_little(crc,buf,len);
  }
  return buf_local._4_4_;
}

Assistant:

unsigned int ZEXPORT crc32(crc, buf, len)
    unsigned int crc;
    const unsigned char FAR *buf;
    unsigned len;
{
    if (buf == Z_NULL) return 0UL;

#ifdef DYNAMIC_CRC_TABLE
    if (crc_table_empty)
        make_crc_table();
#endif /* DYNAMIC_CRC_TABLE */

#ifdef BYFOUR
    if (sizeof(void *) == sizeof(ptrdiff_t)) {
        u4 endian;

        endian = 1;
        if (*((unsigned char *)(&endian)))
            return crc32_little(crc, buf, len);
        else
            return crc32_big(crc, buf, len);
    }
#endif /* BYFOUR */
    crc = crc ^ 0xffffffffUL;
    while (len >= 8) {
        DO8;
        len -= 8;
    }
    if (len) do {
        DO1;
    } while (--len);
    return crc ^ 0xffffffffUL;
}